

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,TWords *words)

{
  pointer pTVar1;
  size_t i;
  ulong uVar2;
  TWord *w;
  pointer word;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auStack_58 [8];
  TWordIds sentence;
  double local_38;
  
  sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar1 = (words->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (word = (words->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
              _M_impl.super__Vector_impl_data._M_start; word != pTVar1; word = word + 1) {
    sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = GetWordIdNoCreate(this,word);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
               (uint *)((long)&sentence.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  if (auStack_58 ==
      (undefined1  [8])
      sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = 2.2250738585072014e-308;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
               &this->UnknownWordId);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
               &this->UnknownWordId);
    local_38 = 0.0;
    uVar2 = 0;
    while( true ) {
      if (((long)sentence.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)auStack_58 >> 2) - 2U <= uVar2) break;
      dVar3 = GetGram1Prob(this,*(TWordId *)((long)auStack_58 + uVar2 * 4));
      dVar3 = log(dVar3);
      dVar4 = GetGram2Prob(this,*(TWordId *)((long)auStack_58 + uVar2 * 4),
                           *(TWordId *)((long)auStack_58 + (uVar2 + 1) * 4));
      dVar4 = log(dVar4);
      dVar5 = GetGram3Prob(this,*(TWordId *)((long)auStack_58 + uVar2 * 4),
                           *(TWordId *)((long)auStack_58 + (uVar2 + 1) * 4),
                           *(TWordId *)((long)auStack_58 + (uVar2 + 2) * 4));
      dVar5 = log(dVar5);
      local_38 = local_38 + dVar3 + dVar4 + dVar5;
      uVar2 = uVar2 + 1;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
  return local_38;
}

Assistant:

double TLangModel::Score(const TWords& words) const {
    TWordIds sentence;
    for (auto&& w: words) {
        sentence.push_back(GetWordIdNoCreate(w));
    }
    if (sentence.empty()) {
        return std::numeric_limits<double>::min();
    }

    sentence.push_back(UnknownWordId);
    sentence.push_back(UnknownWordId);

    double result = 0;
    for (size_t i = 0; i < sentence.size() - 2; ++i) {
        result += log(GetGram1Prob(sentence[i]));
        result += log(GetGram2Prob(sentence[i], sentence[i + 1]));
        result += log(GetGram3Prob(sentence[i], sentence[i + 1], sentence[i + 2]));
    }
    return result;
}